

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

ll_node * ll_append(ll_node *root,void *ptr,size_t isize)

{
  ll_node *node;
  ll_node *plVar1;
  
  node = ll_create_node(ptr,isize);
  if (root != (ll_node *)0x0) {
    do {
      plVar1 = root;
      root = plVar1->next;
    } while (root != (ll_node *)0x0);
    plVar1->next = node;
    if (node != (ll_node *)0x0) {
      return node;
    }
  }
  ll_free_node(node);
  return (ll_node *)0x0;
}

Assistant:

struct ll_node *ll_append(struct ll_node *root, const void *ptr, size_t isize)
{
	struct ll_node *new_node = ll_create_node(ptr, isize);
	struct ll_node *result = ll_append_node(root, new_node);
	if (new_node != NULL && result != NULL) {
		return result;
	}
	ll_free_node(new_node);
	return NULL;
}